

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_FloatToString.h
# Opt level: O2

char * choc::text::FloatToStringBuffer<double>::writeAndGetEnd
                 (char *pos,double value,int maxDecimalPlaces)

{
  ulong uVar1;
  uint32_t totalLength;
  ulong uVar2;
  char *pcVar3;
  int maxDecimalPlaces_00;
  MantissaAndExponent rhs;
  MantissaAndExponent MVar4;
  MantissaAndExponent MVar5;
  MantissaAndExponent upperBound;
  int K;
  MantissaAndExponent powerOf10;
  Limits limits;
  int *in_stack_ffffffffffffff88;
  int local_6c;
  uint64_t local_68;
  MantissaAndExponent local_60;
  undefined1 local_50 [12];
  uint64_t local_40;
  int local_38;
  
  if ((long)value < 0) {
    *pos = '-';
    value = ABS(value);
    if (value == 0.0) {
      pos[1] = '0';
      pos[2] = '.';
      pos[3] = '0';
      return pos + 4;
    }
    pos = pos + 1;
  }
  else if (value == 0.0) {
    pos[0] = '0';
    pos[1] = '.';
    pos[2] = '0';
    goto LAB_001fa406;
  }
  if (value == INFINITY) {
    ((FloatToStringBuffer<double> *)pos)->storage[0] = 'i';
    ((FloatToStringBuffer<double> *)pos)->storage[1] = 'n';
    ((FloatToStringBuffer<double> *)pos)->storage[2] = 'f';
  }
  else {
    if (value != NAN) {
      MVar4 = MantissaAndExponent::create((uint64_t)value,(ulong)value & 0xfffffffffffff);
      uVar2 = MVar4.mantissa;
      Limits::Limits((Limits *)local_50,MVar4);
      MVar5 = createPowerOf10(local_38,&local_6c);
      local_60.mantissa = MVar5.mantissa;
      local_60.exponent = MVar5.exponent;
      uVar1 = 0x3f;
      if (uVar2 != 0) {
        for (; uVar2 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      MVar4.exponent = MVar4.exponent - (int)(uVar1 ^ 0x3f);
      MVar4.mantissa = uVar2 << ((byte)(uVar1 ^ 0x3f) & 0x3f);
      MVar4._12_4_ = 0;
      MVar4 = MantissaAndExponent::operator*(&local_60,MVar4);
      local_68 = MVar4.mantissa;
      MVar5.exponent = local_38;
      MVar5.mantissa = local_40;
      MVar5._12_4_ = 0;
      MVar4 = MantissaAndExponent::operator*(&local_60,MVar5);
      pcVar3 = (char *)(MVar4.mantissa - 1);
      rhs._12_4_ = 0;
      rhs.mantissa = local_50._0_8_;
      rhs.exponent = local_50._8_4_;
      MVar5 = MantissaAndExponent::operator*(&local_60,rhs);
      upperBound._8_8_ = (long)pcVar3 - local_68;
      upperBound.mantissa = (ulong)(uint)MVar4.exponent;
      totalLength = generateDigits((FloatToStringBuffer<double> *)pos,pcVar3,upperBound,
                                   (~MVar5.mantissa + MVar4.mantissa) - 1,(uint64_t)&local_6c,
                                   in_stack_ffffffffffffff88);
      maxDecimalPlaces_00 = 0x144;
      if (-1 < maxDecimalPlaces) {
        maxDecimalPlaces_00 = maxDecimalPlaces;
      }
      pcVar3 = addDecimalPointAndExponent(pos,totalLength,local_6c,maxDecimalPlaces_00);
      return pcVar3;
    }
    ((FloatToStringBuffer<double> *)pos)->storage[0] = 'n';
    ((FloatToStringBuffer<double> *)pos)->storage[1] = 'a';
    ((FloatToStringBuffer<double> *)pos)->storage[2] = 'n';
  }
LAB_001fa406:
  return ((FloatToStringBuffer<double> *)pos)->storage + 3;
}

Assistant:

static const char* writeAndGetEnd (char* pos, FloatOrDouble value, int maxDecimalPlaces)
    {
        auto floatBits = getFloatBits (value);

        if ((floatBits & signMask) == 0)
        {
            if (isZero (floatBits))  return writeZero (pos);
        }
        else
        {
            pos = write (pos, '-');

            if (isZero (floatBits))  return writeZero (pos);

            value = -value;
            floatBits &= ~signMask;
        }

        if (floatBits == nanBits)  return write (pos, 'n', 'a', 'n');
        if (floatBits == infBits)  return write (pos, 'i', 'n', 'f');

        auto v = MantissaAndExponent::create (floatBits, floatBits & significandMask);
        Limits limits (v);

        int K;
        auto powerOf10 = createPowerOf10 (limits.upper.exponent, K);
        auto w = powerOf10 * v.normalized();
        auto upperBound = powerOf10 * limits.upper;
        upperBound.mantissa--;
        auto lowerBound = powerOf10 * limits.lower;
        lowerBound.mantissa++;

        auto totalLength = generateDigits (pos, upperBound, upperBound.mantissa - w.mantissa, upperBound.mantissa - lowerBound.mantissa, K);
        return addDecimalPointAndExponent (pos, totalLength, K, maxDecimalPlaces < 0 ? defaultNumDecimalPlaces : maxDecimalPlaces);
    }